

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddr_acl.c
# Opt level: O0

_Bool netaddr_acl_check_accept(netaddr_acl *acl,netaddr *addr)

{
  _Bool _Var1;
  netaddr *addr_local;
  netaddr_acl *acl_local;
  
  if (((acl->reject_first & 1U) == 0) ||
     (_Var1 = _is_in_array(acl->reject,acl->reject_count,addr), !_Var1)) {
    _Var1 = _is_in_array(acl->accept,acl->accept_count,addr);
    if (_Var1) {
      acl_local._7_1_ = true;
    }
    else if (((acl->reject_first & 1U) == 0) &&
            (_Var1 = _is_in_array(acl->reject,acl->reject_count,addr), _Var1)) {
      acl_local._7_1_ = false;
    }
    else {
      acl_local._7_1_ = (_Bool)(acl->accept_default & 1);
    }
  }
  else {
    acl_local._7_1_ = false;
  }
  return acl_local._7_1_;
}

Assistant:

bool
netaddr_acl_check_accept(const struct netaddr_acl *acl, const struct netaddr *addr) {
  if (acl->reject_first) {
    if (_is_in_array(acl->reject, acl->reject_count, addr)) {
      return false;
    }
  }

  if (_is_in_array(acl->accept, acl->accept_count, addr)) {
    return true;
  }

  if (!acl->reject_first) {
    if (_is_in_array(acl->reject, acl->reject_count, addr)) {
      return false;
    }
  }

  return acl->accept_default;
}